

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMove4<(moira::Instr)71,(moira::Mode)8,(moira::Size)1>(Moira *this,u16 opcode)

{
  int *piVar1;
  bool bVar2;
  u32 in_EAX;
  u32 addr;
  uint n;
  u32 data;
  u32 ea;
  
  data = in_EAX;
  bVar2 = readOp<(moira::Mode)8,(moira::Size)1,0ul>(this,opcode & 7,&ea,&data);
  if (bVar2) {
    n = opcode >> 9 & 7;
    (this->reg).sr.n = (bool)((byte)data >> 7);
    (this->reg).sr.z = (byte)data == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    prefetch<0ul>(this);
    (*this->_vptr_Moira[0x19])(this,0xfffffffffffffffe);
    addr = computeEA<(moira::Mode)4,(moira::Size)1,0ul>(this,n);
    _data = CONCAT44(addr,data);
    writeM<(moira::MemSpace)1,(moira::Size)1,5ul>(this,addr,data);
    piVar1 = (int *)((long)this->exec + (ulong)n * 4 + -0x38);
    *piVar1 = *piVar1 + ~(uint)((short)n == 7);
  }
  return;
}

Assistant:

void
Moira::execMove4(u16 opcode)
{
    u16 ird = getIRD();
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    /* Source: http://pasti.fxatari.com/68kdocs/68kPrefetch.html
     *
     * "When the destination addressing mode is pre-decrement, steps 4 and 5
     *  above are inverted. So it behaves like a read modify instruction and it
     *  is a class 0 instruction. Note: The behavior is the same disregarding
     *  transfer size (byte, word or long), and disregarding the source
     *  addressing mode."
     */
    if (!readOp <M,S,STD_AE_FRAME> (src, ea, data)) return;

    // Determine next address error stack frame format
    const u64 flags0 = AE_WRITE | AE_DATA;
    const u64 flags1 = AE_WRITE | AE_DATA | AE_SET_CB3;
    const u64 flags2 = AE_WRITE | AE_DATA;
    int format = (S == Long) ? 0 : reg.sr.c ? 1 : 2;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch();
    sync(-2);

    ea = computeEA<MODE_PD, S>(dst);
    
    // Check for address error
    if (misaligned<S>(ea)) {
        if (format == 0) execAddressError(makeFrame<flags0>(ea + 2, reg.pc + 2, getSR(), ird));
        if (format == 1) execAddressError(makeFrame<flags1>(ea, reg.pc + 2), 2);
        if (format == 2) execAddressError(makeFrame<flags2>(ea, reg.pc + 2), 2);
        if (S != Long) updateAn <MODE_PD, S> (dst);
        return;
    }
    
    writeM<MODE_PD, S, REVERSE | POLLIPL>(ea, data);
    updateAn<MODE_PD, S>(dst);
}